

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.c
# Opt level: O1

void lace_resume(void)

{
  int iVar1;
  uint uVar2;
  
  do {
    if (lace_awaken_count < 0) {
      iVar1 = 2;
    }
    else if (lace_awaken_count == 0) {
      LOCK();
      lace_awaken_count = -1;
      UNLOCK();
      if (n_workers != 0) {
        uVar2 = 0;
        do {
          sem_post((sem_t *)&suspend_semaphore);
          uVar2 = uVar2 + 1;
        } while (uVar2 < n_workers);
      }
      lace_awaken_count = 1;
      iVar1 = 3;
    }
    else {
      lace_awaken_count = lace_awaken_count + 1;
      LOCK();
      UNLOCK();
      iVar1 = 3;
    }
  } while (iVar1 != 3);
  return;
}

Assistant:

void
lace_resume()
{
    while (1) {
        int state = atomic_load_explicit(&lace_awaken_count, memory_order_consume);
        if (state < 0) {
            continue; // wait until suspending is done
        } else if (state == 0) {
            int next = -1; // intermediate state
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) {
                for (unsigned int i=0; i<n_workers; i++) sem_post(&suspend_semaphore);
                atomic_store_explicit(&lace_awaken_count, 1, memory_order_release);
                break;
            }
        } else {
            int next = state + 1;
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) break;
        }
    }
}